

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O3

NodeRef __thiscall
embree::avx::BVHNBuilderQuantizedVirtual<4>::
BVHNBuilderT<embree::avx::CreateLeafQuantized<4,_embree::QuadMi<4>_>_>::createLeaf
          (BVHNBuilderT<embree::avx::CreateLeafQuantized<4,_embree::QuadMi<4>_>_> *this,
          PrimRef *prims,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  float fVar3;
  float fVar4;
  ThreadLocal2 *this_00;
  iterator __position;
  Scene *pSVar5;
  Geometry *pGVar6;
  long lVar7;
  __pointer_type pFVar8;
  undefined4 uVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  long lVar15;
  unsigned_long uVar16;
  PrimRef *pPVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  ThreadLocal *pTVar21;
  undefined1 auVar22 [16];
  undefined1 in_ZMM0 [64];
  vuint<4> geomID;
  vuint<4> primID;
  vuint<4> v1;
  vuint<4> v0;
  vuint<4> v2;
  undefined1 local_b8 [16];
  ulong local_a8;
  __pointer_type local_a0;
  undefined1 local_98 [16];
  ulong local_88;
  ulong uStack_80;
  ThreadLocal2 *local_78;
  undefined8 uStack_70;
  ulong local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ThreadLocal *local_38;
  
  auVar22 = in_ZMM0._0_16_;
  uVar16 = set->_begin;
  local_a8 = (set->_end - uVar16) + 3;
  local_60 = local_a8 >> 2;
  local_88 = local_60 * 0x60;
  local_a0 = alloc->alloc;
  pTVar21 = alloc->talloc1;
  this_00 = pTVar21->parent;
  if (local_a0 != (this_00->alloc)._M_b._M_p) {
    local_98[8] = 1;
    local_98._0_8_ = this_00;
    local_38 = pTVar21;
    MutexSys::lock(&this_00->mutex);
    pFVar8 = local_a0;
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    if (local_a0 == (__pointer_type)0x0) {
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = local_a0->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = local_a0->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = local_a0;
    UNLOCK();
    local_b8[8] = 1;
    local_b8._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    auVar22 = (undefined1  [16])0x0;
    local_78 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (pFVar8->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pFVar8->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&pFVar8->thread_local_allocators,__position,&local_78);
    }
    else {
      *__position._M_current = this_00;
      pppTVar2 = &(pFVar8->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    pTVar21 = local_38;
    if (local_98[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_98._0_8_);
    }
  }
  uVar12 = local_88;
  pTVar21->bytesUsed = pTVar21->bytesUsed + local_88;
  sVar13 = pTVar21->cur;
  uVar14 = (ulong)(-(int)sVar13 & 0xf);
  uVar10 = sVar13 + local_88 + uVar14;
  pTVar21->cur = uVar10;
  if (pTVar21->end < uVar10) {
    pTVar21->cur = sVar13;
    uVar10 = pTVar21->allocBlockSize;
    if (local_88 * 4 < uVar10 || local_88 * 4 - uVar10 == 0) {
      local_b8._0_8_ = uVar10;
      pcVar11 = (char *)FastAllocator::malloc(local_a0,(size_t)local_b8);
      pTVar21->ptr = pcVar11;
      sVar13 = (pTVar21->end - pTVar21->cur) + pTVar21->bytesWasted;
      pTVar21->bytesWasted = sVar13;
      pTVar21->end = local_b8._0_8_;
      pTVar21->cur = uVar12;
      if ((ulong)local_b8._0_8_ < uVar12) {
        pTVar21->cur = 0;
        local_b8._0_8_ = pTVar21->allocBlockSize;
        pcVar11 = (char *)FastAllocator::malloc(local_a0,(size_t)local_b8);
        pTVar21->ptr = pcVar11;
        sVar13 = (pTVar21->end - pTVar21->cur) + pTVar21->bytesWasted;
        pTVar21->bytesWasted = sVar13;
        pTVar21->end = local_b8._0_8_;
        pTVar21->cur = uVar12;
        if ((ulong)local_b8._0_8_ < uVar12) {
          pTVar21->cur = 0;
          pcVar11 = (char *)0x0;
        }
        else {
          pTVar21->bytesWasted = sVar13;
        }
      }
      else {
        pTVar21->bytesWasted = sVar13;
      }
    }
    else {
      pcVar11 = (char *)FastAllocator::malloc(local_a0,(size_t)&local_88);
    }
  }
  else {
    pTVar21->bytesWasted = pTVar21->bytesWasted + uVar14;
    pcVar11 = pTVar21->ptr + (uVar10 - local_88);
  }
  if (3 < local_a8) {
    lVar15 = 0;
    auVar22 = vpcmpeqd_avx(auVar22,auVar22);
    do {
      uVar12 = set->_end;
      pSVar5 = ((this->createLeafFunc).bvh)->scene;
      pPVar17 = prims + uVar16;
      local_78 = (ThreadLocal2 *)0x0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      lVar18 = 0;
      local_b8 = auVar22;
      local_98 = auVar22;
      do {
        if (uVar16 < uVar12) {
          fVar3 = (pPVar17->lower).field_0.m128[3];
          *(float *)(local_b8 + lVar18) = fVar3;
          fVar4 = (pPVar17->upper).field_0.m128[3];
          *(float *)(local_98 + lVar18) = fVar4;
          pGVar6 = (pSVar5->geometries).items[(uint)fVar3].ptr;
          lVar20 = (ulong)(uint)fVar4 *
                   pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar7 = *(long *)&pGVar6->field_0x58;
          uVar19 = *(uint *)&pGVar6[1].intersectionFilterN >> 2;
          *(uint *)((long)&local_78 + lVar18) = *(int *)(lVar7 + lVar20) * uVar19;
          *(uint *)((long)&local_88 + lVar18) = *(int *)(lVar7 + 4 + lVar20) * uVar19;
          *(uint *)((long)&local_48 + lVar18) = *(int *)(lVar7 + 8 + lVar20) * uVar19;
          *(uint *)((long)&local_58 + lVar18) = uVar19 * *(int *)(lVar7 + 0xc + lVar20);
          uVar16 = uVar16 + 1;
        }
        else if (lVar18 != 0) {
          *(undefined4 *)(local_b8 + lVar18) = local_b8._0_4_;
          *(undefined4 *)(local_98 + lVar18) = 0xffffffff;
          uVar9 = local_78._0_4_;
          *(undefined4 *)((long)&local_78 + lVar18) = local_78._0_4_;
          *(undefined4 *)((long)&local_88 + lVar18) = uVar9;
          *(undefined4 *)((long)&local_48 + lVar18) = uVar9;
          *(undefined4 *)((long)&local_58 + lVar18) = uVar9;
        }
        if (uVar16 < uVar12) {
          pPVar17 = prims + uVar16;
        }
        lVar18 = lVar18 + 4;
      } while (lVar18 != 0x10);
      lVar18 = lVar15 * 0x60;
      *(ThreadLocal2 **)(pcVar11 + lVar18) = local_78;
      *(undefined8 *)(pcVar11 + lVar18 + 8) = uStack_70;
      *(ulong *)(pcVar11 + lVar18 + 0x10) = local_88;
      *(ulong *)((long)(pcVar11 + lVar18 + 0x10) + 8) = uStack_80;
      *(undefined8 *)(pcVar11 + lVar18 + 0x20) = local_48;
      *(undefined8 *)(pcVar11 + lVar18 + 0x20 + 8) = uStack_40;
      *(undefined8 *)(pcVar11 + lVar18 + 0x30) = local_58;
      *(undefined8 *)(pcVar11 + lVar18 + 0x30 + 8) = uStack_50;
      *(undefined8 *)(pcVar11 + lVar18 + 0x40) = local_b8._0_8_;
      *(undefined8 *)(pcVar11 + lVar18 + 0x40 + 8) = local_b8._8_8_;
      *(undefined8 *)(pcVar11 + lVar18 + 0x50) = local_98._0_8_;
      *(undefined8 *)(pcVar11 + lVar18 + 0x50 + 8) = local_98._8_8_;
      lVar15 = lVar15 + 1;
    } while (lVar15 != local_60 + (local_60 == 0));
  }
  uVar12 = 7;
  if (local_60 < 7) {
    uVar12 = local_60;
  }
  return (NodeRef)(uVar12 | (ulong)pcVar11 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }